

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleBase.hpp
# Opt level: O0

TestCaseGroup *
vkt::pipeline::
makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtOffsetPixelCenter>>
          (TestContext *testCtx,string *groupName,UVec3 *imageSizes,deUint32 imageSizesElemCount,
          VkSampleCountFlagBits *imageSamples,deUint32 imageSamplesElemCount)

{
  uint uVar1;
  TestCaseGroup *pTVar2;
  char *pcVar3;
  ostream *poVar4;
  TestNode *pTVar5;
  MultisampleCaseBase *node;
  TestNode *node_00;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_22c [8];
  ImageMSParams imageMSParams;
  VkSampleCountFlagBits samples;
  deUint32 imageSamplesNdx;
  undefined1 local_1f0 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> sizeGroup;
  ostringstream imageSizeStream;
  undefined1 local_68 [8];
  UVec3 imageSize;
  deUint32 imageSizeNdx;
  undefined1 local_48 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> caseGroup;
  deUint32 imageSamplesElemCount_local;
  VkSampleCountFlagBits *imageSamples_local;
  deUint32 imageSizesElemCount_local;
  UVec3 *imageSizes_local;
  string *groupName_local;
  TestContext *testCtx_local;
  
  caseGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _12_4_ = imageSamplesElemCount;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,pcVar3,"");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)imageSize.m_data + 0xb));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_48,pTVar2
            );
  for (imageSize.m_data[1] = 0; imageSize.m_data[1] < imageSizesElemCount;
      imageSize.m_data[1] = imageSize.m_data[1] + 1) {
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)local_68,imageSizes + imageSize.m_data[1]);
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)
               &sizeGroup.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8);
    uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_68);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (&sizeGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data.field_0x8,uVar1);
    poVar4 = std::operator<<(poVar4,"_");
    uVar1 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_68);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
    poVar4 = std::operator<<(poVar4,"_");
    uVar1 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_68);
    std::ostream::operator<<(poVar4,uVar1);
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    samples._3_1_ = 1;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,pcVar3,"");
    samples._3_1_ = 0;
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&samples + 2));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_1f0,
               pTVar2);
    std::__cxx11::string::~string((string *)&imageSamplesNdx);
    for (imageMSParams.imageSize.m_data[2] = 0;
        imageMSParams.imageSize.m_data[2] <
        (uint)caseGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              _12_4_; imageMSParams.imageSize.m_data[2] = imageMSParams.imageSize.m_data[2] + 1) {
      imageMSParams.imageSize.m_data[1] = imageSamples[imageMSParams.imageSize.m_data[2]];
      multisample::ImageMSParams::ImageMSParams
                ((ImageMSParams *)local_22c,imageMSParams.imageSize.m_data[1],(UVec3 *)local_68);
      pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                ::operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_1f0)->super_TestNode;
      de::toString<vk::VkSampleCountFlagBits>(&local_270,imageMSParams.imageSize.m_data + 1);
      std::operator+(&local_250,"samples_",&local_270);
      node = multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtOffsetPixelCenter>::
             createCase(testCtx,&local_250,(ImageMSParams *)local_22c);
      tcu::TestNode::addChild(pTVar5,(TestNode *)node);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
    }
    pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_48)->super_TestNode;
    node_00 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
               release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_1f0)->super_TestNode;
    tcu::TestNode::addChild(pTVar5,node_00);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_1f0);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)
               &sizeGroup.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8);
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_48)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_48);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* makeMSGroup	(tcu::TestContext&							testCtx,
								 const std::string							groupName,
								 const tcu::UVec3							imageSizes[],
								 const deUint32								imageSizesElemCount,
								 const vk::VkSampleCountFlagBits			imageSamples[],
								 const deUint32								imageSamplesElemCount)
{
	de::MovePtr<tcu::TestCaseGroup> caseGroup(new tcu::TestCaseGroup(testCtx, groupName.c_str(), ""));

	for (deUint32 imageSizeNdx = 0u; imageSizeNdx < imageSizesElemCount; ++imageSizeNdx)
	{
		const tcu::UVec3	imageSize = imageSizes[imageSizeNdx];
		std::ostringstream	imageSizeStream;

		imageSizeStream << imageSize.x() << "_" << imageSize.y() << "_" << imageSize.z();

		de::MovePtr<tcu::TestCaseGroup> sizeGroup(new tcu::TestCaseGroup(testCtx, imageSizeStream.str().c_str(), ""));

		for (deUint32 imageSamplesNdx = 0u; imageSamplesNdx < imageSamplesElemCount; ++imageSamplesNdx)
		{
			const vk::VkSampleCountFlagBits		samples = imageSamples[imageSamplesNdx];
			const multisample::ImageMSParams	imageMSParams = multisample::ImageMSParams(samples, imageSize);

			sizeGroup->addChild(CaseClass::createCase(testCtx, "samples_" + de::toString(samples), imageMSParams));
		}

		caseGroup->addChild(sizeGroup.release());
	}
	return caseGroup.release();
}